

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_4fPoint * __thiscall ON_4fPoint::operator=(ON_4fPoint *this,float *p)

{
  float fVar1;
  
  if (p == (float *)0x0) {
    this->z = 0.0;
    this->x = 0.0;
    this->y = 0.0;
    fVar1 = 1.0;
  }
  else {
    this->x = *p;
    this->y = p[1];
    this->z = p[2];
    fVar1 = p[3];
  }
  this->w = fVar1;
  return this;
}

Assistant:

ON_4fPoint& ON_4fPoint::operator=(const float* p)
{
  if ( p ) {
    x = p[0];
    y = p[1];
    z = p[2];
    w = p[3];
  }
  else {
    x = y = z = 0.0; w = 1.0;
  }
  return *this;
}